

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

infinite_counter<unsigned_long,_18446744073709551615UL> * __thiscall
cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
          (infinite_counter<unsigned_long,_18446744073709551615UL> *this)

{
  reference pvVar1;
  value_type_conflict3 local_18;
  infinite_counter<unsigned_long,_18446744073709551615UL> *local_10;
  infinite_counter<unsigned_long,_18446744073709551615UL> *this_local;
  
  local_10 = this;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->count_);
  if (*pvVar1 == 0xffffffffffffffff) {
    local_18 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->count_,&local_18);
  }
  else {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->count_);
    *pvVar1 = *pvVar1 + 1;
  }
  return this;
}

Assistant:

infinite_counter& operator++() {
        if (count_.back() == max)
            count_.push_back(0);
        else
            ++count_.back();
        return *this;
    }